

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_exception.hpp
# Opt level: O2

string * __thiscall
iutest::detail::FormatCxxException_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *description)

{
  ostream *poVar1;
  char *pcVar2;
  iu_stringstream strm;
  stringstream asStack_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = &local_188;
  if (this == (detail *)0x0) {
    pcVar2 = "Unknown C++ exception";
  }
  else {
    poVar1 = std::operator<<(poVar1,"C++ exception with description \"");
    poVar1 = std::operator<<(poVar1,(char *)this);
    pcVar2 = "\"";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatCxxException(const char* description)
{
    iu_stringstream strm;
    if( description != NULL )
    {
        strm << "C++ exception with description \"" << description << "\"";
    }
    else
    {
        strm << "Unknown C++ exception";
    }
    return strm.str();
}